

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clistats.cpp
# Opt level: O1

int __thiscall FixedSizeCache<int>::max(FixedSizeCache<int> *this)

{
  int iVar1;
  int *piVar2;
  long lVar3;
  runtime_error *this_00;
  int *piVar4;
  int *piVar5;
  
  iVar1 = this->_count;
  if ((long)iVar1 == 0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"FixedSizeCache::max() called on empty cache");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  piVar5 = (this->_data).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (iVar1 != 1) {
    lVar3 = (long)iVar1 * 4 + -4;
    piVar4 = piVar5;
    do {
      piVar4 = piVar4 + 1;
      piVar2 = piVar4;
      if (*piVar4 <= *piVar5) {
        piVar2 = piVar5;
      }
      piVar5 = piVar2;
      lVar3 = lVar3 + -4;
    } while (lVar3 != 0);
  }
  return *piVar5;
}

Assistant:

bool
    empty() const
    {
        return (this->_count == 0);
    }